

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,char **arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  string_view format_00;
  Arg *this_00;
  Arg local_1d8;
  Arg local_1a8;
  Arg local_178;
  Arg local_148;
  Arg local_118;
  Arg local_e8;
  Arg local_b8;
  lts_20250127 *local_88;
  char *pcStack_80;
  string local_70;
  string_view local_50;
  char **local_40;
  char **arg_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  Output *this_local;
  string_view format_local;
  
  pcStack_80 = format._M_str;
  local_88 = (lts_20250127 *)format._M_len;
  local_40 = arg_2;
  arg_local_2 = (char **)arg_1;
  arg_local_1 = arg;
  arg_local = &this->output_;
  this_local = (Output *)local_88;
  format_local._M_len = (size_t)pcStack_80;
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_b8,arg);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>
            (&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)arg_local_2);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_118,*local_40);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_148,arg_3);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_178,arg_4);
  this_00 = &local_1a8;
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(this_00,arg_5);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_1d8,arg_6);
  format_00._M_str = (char *)&local_b8;
  format_00._M_len = (size_t)pcStack_80;
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_70,local_88,format_00,&local_e8,&local_118,&local_148,&local_178,this_00,
             &local_1d8,this_00);
  local_50 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
  Write(this,local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }